

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

void __thiscall SceneParser::parseFile(SceneParser *this)

{
  int iVar1;
  Group *pGVar2;
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  char local_78 [8];
  char token [100];
  SceneParser *this_local;
  
  unique0x1000021f = this;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar1 = getToken(this,local_78);
          if (iVar1 == 0) {
            return;
          }
          iVar1 = strcmp(local_78,"PerspectiveCamera");
          if (iVar1 != 0) break;
          parsePerspectiveCamera(this);
        }
        iVar1 = strcmp(local_78,"Background");
        if (iVar1 != 0) break;
        parseBackground(this);
      }
      iVar1 = strcmp(local_78,"Materials");
      if (iVar1 != 0) break;
      parseMaterials(this);
    }
    iVar1 = strcmp(local_78,"Group");
    if (iVar1 != 0) break;
    pGVar2 = parseGroup(this);
    this->_group = pGVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Unknown token in parseFile: \'",&local_d9);
  std::operator+(local_b8,(char *)local_d8);
  std::operator+(local_98,(char *)local_b8);
  _PostError(local_98);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  exit(1);
}

Assistant:

void
SceneParser::parseFile() {
    // At the top level, the scene can have a camera,
    // background color and a group of objects.
    char token[MAX_PARSER_TOKEN_LENGTH];
    while (getToken(token)) {
        if (!strcmp(token, "PerspectiveCamera")) {
            parsePerspectiveCamera();
        } else if (!strcmp(token, "Background")) {
            parseBackground();
        } else if (!strcmp(token, "Materials")) {
            parseMaterials();
        } else if (!strcmp(token, "Group")) {
            _group = parseGroup();
        } else {
            _PostError(
                    std::string("Unknown token in parseFile: '") + token + "'\n");
            exit(1);
        }
    }
}